

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_bzip2.c
# Opt level: O2

int bzip2_reader_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  int iVar2;
  void *__s1;
  ssize_t avail;
  
  __s1 = __archive_read_filter_ahead(filter,0xe,&avail);
  iVar2 = 0;
  if (((__s1 != (void *)0x0) && (iVar1 = bcmp(__s1,"BZh",3), iVar1 == 0)) &&
     (iVar2 = 0, 0xf6 < (byte)(*(char *)((long)__s1 + 3) - 0x3aU))) {
    iVar2 = bcmp((void *)((long)__s1 + 4),"1AY&SY",6);
    if ((iVar2 != 0) && (iVar2 = bcmp((void *)((long)__s1 + 4),anon_var_dwarf_45b2,6), iVar2 != 0))
    {
      return 0;
    }
    iVar2 = 0x4d;
  }
  return iVar2;
}

Assistant:

static int
bzip2_reader_bid(struct archive_read_filter_bidder *self, struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	int bits_checked;

	(void)self; /* UNUSED */

	/* Minimal bzip2 archive is 14 bytes. */
	buffer = __archive_read_filter_ahead(filter, 14, &avail);
	if (buffer == NULL)
		return (0);

	/* First three bytes must be "BZh" */
	bits_checked = 0;
	if (memcmp(buffer, "BZh", 3) != 0)
		return (0);
	bits_checked += 24;

	/* Next follows a compression flag which must be an ASCII digit. */
	if (buffer[3] < '1' || buffer[3] > '9')
		return (0);
	bits_checked += 5;

	/* After BZh[1-9], there must be either a data block
	 * which begins with 0x314159265359 or an end-of-data
	 * marker of 0x177245385090. */
	if (memcmp(buffer + 4, "\x31\x41\x59\x26\x53\x59", 6) == 0)
		bits_checked += 48;
	else if (memcmp(buffer + 4, "\x17\x72\x45\x38\x50\x90", 6) == 0)
		bits_checked += 48;
	else
		return (0);

	return (bits_checked);
}